

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

void __thiscall
Catch::JunitReporter::writeGroup(JunitReporter *this,TestGroupNode *groupNode,double suiteTime)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  undefined4 extraout_var;
  ScopedElement *pSVar4;
  element_type *testCaseNode;
  string local_418;
  allocator<char> local_3f1;
  string local_3f0 [32];
  undefined1 local_3d0 [16];
  string local_3c0;
  allocator<char> local_399;
  string local_398 [32];
  undefined1 local_378 [24];
  shared_ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>
  *child;
  const_iterator __end1;
  const_iterator __begin1;
  ChildNodes *__range1;
  string local_340;
  allocator<char> local_319;
  string local_318;
  allocator<char> local_2f1;
  string local_2f0 [32];
  undefined1 local_2d0 [16];
  string local_2c0;
  allocator<char> local_299;
  string local_298;
  allocator<char> local_271;
  string local_270;
  allocator<char> local_249;
  string local_248 [32];
  undefined1 local_228 [24];
  string local_210 [32];
  undefined1 local_1f0 [8];
  ScopedElement properties;
  allocator<char> local_1b9;
  string local_1b8;
  allocator<char> local_191;
  string local_190;
  allocator<char> local_169;
  string local_168;
  allocator<char> local_141;
  string local_140;
  size_t local_120;
  allocator<char> local_111;
  string local_110;
  unsigned_long local_f0;
  allocator<char> local_e1;
  string local_e0;
  allocator<char> local_b9;
  string local_b8;
  allocator<char> local_91;
  string local_90;
  string *local_70;
  TestGroupStats *stats;
  allocator<char> local_51;
  string local_50 [32];
  undefined1 local_30 [8];
  ScopedElement e;
  double suiteTime_local;
  TestGroupNode *groupNode_local;
  JunitReporter *this_local;
  
  e._8_8_ = suiteTime;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_50,"testsuite",&local_51);
  operator|(Newline,Indent);
  XmlWriter::scopedElement((XmlWriter *)local_30,(string *)&this->xml,(XmlFormatting)local_50);
  std::__cxx11::string::~string(local_50);
  std::allocator<char>::~allocator(&local_51);
  local_70 = (string *)&groupNode->value;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"name",&local_91);
  XmlWriter::writeAttribute(&this->xml,&local_90,local_70);
  std::__cxx11::string::~string((string *)&local_90);
  std::allocator<char>::~allocator(&local_91);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,"errors",&local_b9);
  XmlWriter::writeAttribute<unsigned_int>(&this->xml,&local_b8,&this->unexpectedExceptions);
  std::__cxx11::string::~string((string *)&local_b8);
  std::allocator<char>::~allocator(&local_b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_e0,"failures",&local_e1);
  local_f0 = *(long *)(local_70 + 2) - (ulong)this->unexpectedExceptions;
  XmlWriter::writeAttribute<unsigned_long>(&this->xml,&local_e0,&local_f0);
  std::__cxx11::string::~string((string *)&local_e0);
  std::allocator<char>::~allocator(&local_e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_110,"tests",&local_111);
  local_120 = Counts::total((Counts *)((long)&local_70[1].field_2 + 8));
  XmlWriter::writeAttribute<unsigned_long>(&this->xml,&local_110,&local_120);
  std::__cxx11::string::~string((string *)&local_110);
  std::allocator<char>::~allocator(&local_111);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_140,"hostname",&local_141);
  XmlWriter::writeAttribute<char[4]>(&this->xml,&local_140,(char (*) [4])"tbd");
  std::__cxx11::string::~string((string *)&local_140);
  std::allocator<char>::~allocator(&local_141);
  iVar2 = (*((this->super_CumulativeReporterBase).m_config)->_vptr_IConfig[0xb])();
  if (iVar2 == 2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_168,"time",&local_169);
    XmlWriter::writeAttribute<char[1]>(&this->xml,&local_168,(char (*) [1])0x365802);
    std::__cxx11::string::~string((string *)&local_168);
    std::allocator<char>::~allocator(&local_169);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_190,"time",&local_191);
    XmlWriter::writeAttribute<double>(&this->xml,&local_190,(double *)&e.m_fmt);
    std::__cxx11::string::~string((string *)&local_190);
    std::allocator<char>::~allocator(&local_191);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1b8,"timestamp",&local_1b9);
  (anonymous_namespace)::getCurrentTimestamp_abi_cxx11_();
  XmlWriter::writeAttribute(&this->xml,&local_1b8,(string *)&properties.m_fmt);
  std::__cxx11::string::~string((string *)&properties.m_fmt);
  std::__cxx11::string::~string((string *)&local_1b8);
  std::allocator<char>::~allocator(&local_1b9);
  uVar3 = (*((this->super_CumulativeReporterBase).m_config)->_vptr_IConfig[0xe])();
  if (((uVar3 & 1) != 0) ||
     (iVar2 = (*((this->super_CumulativeReporterBase).m_config)->_vptr_IConfig[0x11])(), iVar2 != 0)
     ) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (local_210,"properties",(allocator<char> *)(local_228 + 0x17));
    operator|(Newline,Indent);
    XmlWriter::scopedElement((XmlWriter *)local_1f0,(string *)&this->xml,(XmlFormatting)local_210);
    std::__cxx11::string::~string(local_210);
    std::allocator<char>::~allocator((allocator<char> *)(local_228 + 0x17));
    uVar3 = (*((this->super_CumulativeReporterBase).m_config)->_vptr_IConfig[0xe])();
    if ((uVar3 & 1) != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_248,"property",&local_249);
      operator|(Newline,Indent);
      XmlWriter::scopedElement((XmlWriter *)local_228,(string *)&this->xml,(XmlFormatting)local_248)
      ;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_270,"name",&local_271);
      pSVar4 = XmlWriter::ScopedElement::writeAttribute<char[8]>
                         ((ScopedElement *)local_228,&local_270,(char (*) [8])"filters");
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_298,"value",&local_299);
      iVar2 = (*((this->super_CumulativeReporterBase).m_config)->_vptr_IConfig[0xf])();
      serializeFilters((string *)(local_2d0 + 0x10),
                       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)CONCAT44(extraout_var,iVar2));
      XmlWriter::ScopedElement::writeAttribute<std::__cxx11::string>
                (pSVar4,&local_298,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (local_2d0 + 0x10));
      std::__cxx11::string::~string((string *)(local_2d0 + 0x10));
      std::__cxx11::string::~string((string *)&local_298);
      std::allocator<char>::~allocator(&local_299);
      std::__cxx11::string::~string((string *)&local_270);
      std::allocator<char>::~allocator(&local_271);
      XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_228);
      std::__cxx11::string::~string(local_248);
      std::allocator<char>::~allocator(&local_249);
    }
    iVar2 = (*((this->super_CumulativeReporterBase).m_config)->_vptr_IConfig[0x11])();
    if (iVar2 != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_2f0,"property",&local_2f1);
      operator|(Newline,Indent);
      XmlWriter::scopedElement((XmlWriter *)local_2d0,(string *)&this->xml,(XmlFormatting)local_2f0)
      ;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_318,"name",&local_319);
      pSVar4 = XmlWriter::ScopedElement::writeAttribute<char[12]>
                         ((ScopedElement *)local_2d0,&local_318,(char (*) [12])"random-seed");
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_340,"value",(allocator<char> *)((long)&__range1 + 7));
      __range1._0_4_ = (*((this->super_CumulativeReporterBase).m_config)->_vptr_IConfig[0x11])();
      XmlWriter::ScopedElement::writeAttribute<unsigned_int>(pSVar4,&local_340,(uint *)&__range1);
      std::__cxx11::string::~string((string *)&local_340);
      std::allocator<char>::~allocator((allocator<char> *)((long)&__range1 + 7));
      std::__cxx11::string::~string((string *)&local_318);
      std::allocator<char>::~allocator(&local_319);
      XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_2d0);
      std::__cxx11::string::~string(local_2f0);
      std::allocator<char>::~allocator(&local_2f1);
    }
    XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_1f0);
  }
  __end1 = std::
           vector<std::shared_ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>,_std::allocator<std::shared_ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>_>_>
           ::begin(&groupNode->children);
  child = (shared_ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>
           *)std::
             vector<std::shared_ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>,_std::allocator<std::shared_ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>_>_>
             ::end(&groupNode->children);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_std::shared_ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>_*,_std::vector<std::shared_ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>,_std::allocator<std::shared_ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>_>_>_>
                                     *)&child), bVar1) {
    local_378._16_8_ =
         __gnu_cxx::
         __normal_iterator<const_std::shared_ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>_*,_std::vector<std::shared_ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>,_std::allocator<std::shared_ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>_>_>_>
         ::operator*(&__end1);
    testCaseNode = std::
                   __shared_ptr_access<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator*((__shared_ptr_access<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)local_378._16_8_);
    writeTestCase(this,testCaseNode);
    __gnu_cxx::
    __normal_iterator<const_std::shared_ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>_*,_std::vector<std::shared_ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>,_std::allocator<std::shared_ptr<Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_>_>_>_>
    ::operator++(&__end1);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_398,"system-out",&local_399);
  operator|(Newline,Indent);
  XmlWriter::scopedElement((XmlWriter *)local_378,(string *)&this->xml,(XmlFormatting)local_398);
  trim((string *)(local_3d0 + 0x10),&this->stdOutForSuite);
  XmlWriter::ScopedElement::writeText
            ((ScopedElement *)local_378,(string *)(local_3d0 + 0x10),Newline);
  std::__cxx11::string::~string((string *)(local_3d0 + 0x10));
  XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_378);
  std::__cxx11::string::~string(local_398);
  std::allocator<char>::~allocator(&local_399);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_3f0,"system-err",&local_3f1);
  operator|(Newline,Indent);
  XmlWriter::scopedElement((XmlWriter *)local_3d0,(string *)&this->xml,(XmlFormatting)local_3f0);
  trim(&local_418,&this->stdErrForSuite);
  XmlWriter::ScopedElement::writeText((ScopedElement *)local_3d0,&local_418,Newline);
  std::__cxx11::string::~string((string *)&local_418);
  XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_3d0);
  std::__cxx11::string::~string(local_3f0);
  std::allocator<char>::~allocator(&local_3f1);
  XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_30);
  return;
}

Assistant:

void JunitReporter::writeGroup(TestGroupNode const &groupNode, double suiteTime) {
        XmlWriter::ScopedElement e = xml.scopedElement("testsuite");

        TestGroupStats const &stats = groupNode.value;
        xml.writeAttribute("name", stats.groupInfo.name);
        xml.writeAttribute("errors", unexpectedExceptions);
        xml.writeAttribute("failures", stats.totals.assertions.failed - unexpectedExceptions);
        xml.writeAttribute("tests", stats.totals.assertions.total());
        xml.writeAttribute("hostname", "tbd"); // !TBD
        if (m_config->showDurations() == ShowDurations::Never)
            xml.writeAttribute("time", "");
        else
            xml.writeAttribute("time", suiteTime);
        xml.writeAttribute("timestamp", getCurrentTimestamp());

        // Write properties if there are any
        if (m_config->hasTestFilters() || m_config->rngSeed() != 0) {
            auto properties = xml.scopedElement("properties");
            if (m_config->hasTestFilters()) {
                xml.scopedElement("property")
                    .writeAttribute("name", "filters")
                    .writeAttribute("value", serializeFilters(m_config->getTestsOrTags()));
            }
            if (m_config->rngSeed() != 0) {
                xml.scopedElement("property")
                    .writeAttribute("name", "random-seed")
                    .writeAttribute("value", m_config->rngSeed());
            }
        }

        // Write test cases
        for (auto const &child : groupNode.children)
            writeTestCase(*child);

        xml.scopedElement("system-out").writeText(trim(stdOutForSuite), XmlFormatting::Newline);
        xml.scopedElement("system-err").writeText(trim(stdErrForSuite), XmlFormatting::Newline);
    }